

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestValueTestCommentBefore::runTestCase(TestValueTestCommentBefore *this)

{
  TestResult *pTVar1;
  Value *this_00;
  Value *in_RCX;
  char *pcVar2;
  string exp2;
  string exp2_1;
  string res2;
  char expected_2 [8];
  char expected [42];
  Value val;
  Value other;
  StreamWriterBuilder wbuilder;
  allocator local_1b9;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  undefined2 uStack_f8;
  undefined3 uStack_f6;
  undefined5 uStack_f3;
  undefined3 uStack_ee;
  Value local_e0;
  Value local_b8;
  StreamWriterBuilder local_90;
  Value local_60;
  Value local_38;
  
  Json::Value::Value(&local_e0,nullValue);
  Json::Value::setComment(&local_e0,"// this comment should appear before",commentBefore);
  Json::StreamWriterBuilder::StreamWriterBuilder(&local_90);
  Json::Value::Value(&local_38,"All");
  this_00 = Json::Value::operator[](&local_90.settings_,"commentStyle");
  Json::Value::operator=(this_00,&local_38);
  Json::Value::~Value(&local_38);
  uStack_f8 = 0x6f66;
  uStack_f6 = 0xa6572;
  uStack_f3 = 0x6c6c756e;
  local_118.field_2._M_local_buf[0] = 's';
  local_118.field_2._M_local_buf[1] = 'h';
  local_118.field_2._M_local_buf[2] = 'o';
  local_118.field_2._M_local_buf[3] = 'u';
  local_118.field_2._M_local_buf[4] = 'l';
  local_118.field_2._M_local_buf[5] = 'd';
  local_118.field_2._M_local_buf[6] = ' ';
  local_118.field_2._M_local_buf[7] = 'a';
  local_118.field_2._8_2_ = 0x7070;
  local_118.field_2._10_3_ = 0x726165;
  local_118.field_2._13_3_ = 0x656220;
  local_118._M_dataplus._M_p = (pointer)0x2073696874202f2f;
  local_118._M_string_length._0_1_ = 'c';
  local_118._M_string_length._1_1_ = 'o';
  local_118._M_string_length._2_1_ = 'm';
  local_118._M_string_length._3_1_ = 'm';
  local_118._M_string_length._4_1_ = 'e';
  local_118._M_string_length._5_1_ = 'n';
  local_118._M_string_length._6_1_ = 't';
  local_118._M_string_length._7_1_ = ' ';
  Json::writeString_abi_cxx11_((string *)&local_b8,(Json *)&local_90,(Factory *)&local_e0,in_RCX);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_178,(char *)&local_118,(allocator *)&local_198);
  std::__cxx11::string::string((string *)&local_1b8,(string *)&local_b8);
  JsonTest::checkStringEqual
            (pTVar1,&local_178,&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x60f,"expected == result");
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_178);
  Json::Value::toStyledString_abi_cxx11_(&local_178,&local_e0);
  std::__cxx11::string::string((string *)&local_1b8,"\n",(allocator *)&local_198);
  std::__cxx11::string::append((char *)&local_1b8);
  std::__cxx11::string::append((char *)&local_1b8);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_198,(string *)&local_1b8);
  std::__cxx11::string::string((string *)&local_158,(string *)&local_178);
  pcVar2 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  JsonTest::checkStringEqual
            (pTVar1,&local_198,&local_158,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x614,"exp2 == res2");
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_b8);
  Json::Value::Value(&local_b8,"hello");
  Json::Value::swapPayload(&local_e0,&local_b8);
  uStack_f8 = 0x6f66;
  uStack_f6 = 0xa6572;
  uStack_f3 = 0x6c6c656822;
  uStack_ee = 0x226f;
  local_118.field_2._M_local_buf[0] = 's';
  local_118.field_2._M_local_buf[1] = 'h';
  local_118.field_2._M_local_buf[2] = 'o';
  local_118.field_2._M_local_buf[3] = 'u';
  local_118.field_2._M_local_buf[4] = 'l';
  local_118.field_2._M_local_buf[5] = 'd';
  local_118.field_2._M_local_buf[6] = ' ';
  local_118.field_2._M_local_buf[7] = 'a';
  local_118.field_2._8_2_ = 0x7070;
  local_118.field_2._10_3_ = 0x726165;
  local_118.field_2._13_3_ = 0x656220;
  local_118._M_dataplus._M_p = (pointer)0x2073696874202f2f;
  local_118._M_string_length._0_1_ = 'c';
  local_118._M_string_length._1_1_ = 'o';
  local_118._M_string_length._2_1_ = 'm';
  local_118._M_string_length._3_1_ = 'm';
  local_118._M_string_length._4_1_ = 'e';
  local_118._M_string_length._5_1_ = 'n';
  local_118._M_string_length._6_1_ = 't';
  local_118._M_string_length._7_1_ = ' ';
  Json::writeString_abi_cxx11_(&local_178,(Json *)&local_90,(Factory *)&local_e0,(Value *)pcVar2);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_1b8,(char *)&local_118,(allocator *)&local_158);
  std::__cxx11::string::string((string *)&local_198,(string *)&local_178);
  JsonTest::checkStringEqual
            (pTVar1,&local_1b8,&local_198,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x61b,"expected == result");
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  Json::Value::toStyledString_abi_cxx11_(&local_1b8,&local_e0);
  std::__cxx11::string::string((string *)&local_198,"\n",(allocator *)&local_158);
  std::__cxx11::string::append((char *)&local_198);
  std::__cxx11::string::append((char *)&local_198);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_158,(string *)&local_198);
  std::__cxx11::string::string((string *)&local_138,(string *)&local_1b8);
  JsonTest::checkStringEqual
            (pTVar1,&local_158,&local_138,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x620,"exp2 == res2");
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_158,"null\n",&local_1b9);
  Json::Value::toStyledString_abi_cxx11_(&local_138,&local_b8);
  pcVar2 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  JsonTest::checkStringEqual
            (pTVar1,&local_158,&local_138,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x621,"\"null\\n\" == other.toStyledString()");
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_178);
  Json::Value::Value(&local_60,"hello");
  Json::Value::operator=(&local_e0,&local_60);
  Json::Value::~Value(&local_60);
  local_138._M_dataplus._M_p = (pointer)0x226f6c6c656822;
  Json::writeString_abi_cxx11_(&local_118,(Json *)&local_90,(Factory *)&local_e0,(Value *)pcVar2);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_178,(char *)&local_138,(allocator *)&local_198);
  std::__cxx11::string::string((string *)&local_1b8,(string *)&local_118);
  JsonTest::checkStringEqual
            (pTVar1,&local_178,&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x629,"expected == result");
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_178);
  Json::Value::toStyledString_abi_cxx11_(&local_178,&local_e0);
  std::__cxx11::string::string((string *)&local_1b8,"",(allocator *)&local_198);
  std::__cxx11::string::append((char *)&local_1b8);
  std::__cxx11::string::append((char *)&local_1b8);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)&local_198,(string *)&local_1b8);
  std::__cxx11::string::string((string *)&local_158,(string *)&local_178);
  JsonTest::checkStringEqual
            (pTVar1,&local_198,&local_158,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x62e,"exp2 == res2");
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_118);
  Json::Value::~Value(&local_b8);
  Json::StreamWriterBuilder::~StreamWriterBuilder(&local_90);
  Json::Value::~Value(&local_e0);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, CommentBefore) {
  Json::Value val; // fill val
  val.setComment("// this comment should appear before", Json::commentBefore);
  Json::StreamWriterBuilder wbuilder;
  wbuilder.settings_["commentStyle"] = "All";
  {
    char const expected[] = "// this comment should appear before\nnull";
    std::string result = Json::writeString(wbuilder, val);
    JSONTEST_ASSERT_STRING_EQUAL(expected, result);
    std::string res2 = val.toStyledString();
    std::string exp2 = "\n";
    exp2 += expected;
    exp2 += "\n";
    JSONTEST_ASSERT_STRING_EQUAL(exp2, res2);
  }
  Json::Value other = "hello";
  val.swapPayload(other);
  {
    char const expected[] = "// this comment should appear before\n\"hello\"";
    std::string result = Json::writeString(wbuilder, val);
    JSONTEST_ASSERT_STRING_EQUAL(expected, result);
    std::string res2 = val.toStyledString();
    std::string exp2 = "\n";
    exp2 += expected;
    exp2 += "\n";
    JSONTEST_ASSERT_STRING_EQUAL(exp2, res2);
    JSONTEST_ASSERT_STRING_EQUAL("null\n", other.toStyledString());
  }
  val = "hello";
  // val.setComment("// this comment should appear before", Json::CommentPlacement::commentBefore);
  // Assignment over-writes comments.
  {
    char const expected[] = "\"hello\"";
    std::string result = Json::writeString(wbuilder, val);
    JSONTEST_ASSERT_STRING_EQUAL(expected, result);
    std::string res2 = val.toStyledString();
    std::string exp2 = "";
    exp2 += expected;
    exp2 += "\n";
    JSONTEST_ASSERT_STRING_EQUAL(exp2, res2);
  }
}